

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::Utils::getBlockVariableDefinition_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,qualifierSet *qualifiers,GLchar *type_name,
          GLchar *variable_name)

{
  qualifierSet *qualifiers_00;
  size_t position;
  size_t local_48;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"QUALIFIER_LISTTYPE VARIABLE_NAME",
             (allocator<char> *)&local_40);
  local_48 = 0;
  getQualifiersListString_abi_cxx11_(&local_40,this,qualifiers_00);
  replaceToken("QUALIFIER_LIST",&local_48,local_40._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("TYPE",&local_48,(GLchar *)qualifiers,__return_storage_ptr__);
  replaceToken("VARIABLE_NAME",&local_48,type_name,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getBlockVariableDefinition(const qualifierSet& qualifiers, const glw::GLchar* type_name,
											  const glw::GLchar* variable_name)
{
	/* Templates */
	static const GLchar* def_template = "QUALIFIER_LISTTYPE VARIABLE_NAME";

	/* Tokens */
	static const GLchar* token_type			 = "TYPE";
	static const GLchar* token_variable_name = "VARIABLE_NAME";
	static const GLchar* token_qual_list	 = "QUALIFIER_LIST";

	/* Variables */
	std::string variable_definition = def_template;
	size_t		position			= 0;

	/* Get qualifiers list */
	const std::string& list = getQualifiersListString(qualifiers);

	/* Replace tokens */
	Utils::replaceToken(token_qual_list, position, list.c_str(), variable_definition);
	Utils::replaceToken(token_type, position, type_name, variable_definition);
	Utils::replaceToken(token_variable_name, position, variable_name, variable_definition);

	/* Done */
	return variable_definition;
}